

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O2

void uv__metrics_update_idle_time(uv_loop_t *loop)

{
  void *pvVar1;
  long lVar2;
  uint64_t uVar3;
  uint64_t exit_time;
  uint64_t entry_time;
  uv__loop_metrics_t *loop_metrics;
  uv_loop_t *loop_local;
  
  if (((*loop->internal_fields & 1) != 0) &&
     (pvVar1 = loop->internal_fields, *(long *)((long)pvVar1 + 0x88) != 0)) {
    uVar3 = uv_hrtime();
    uv_mutex_lock((uv_mutex_t *)((long)pvVar1 + 0x98));
    lVar2 = *(long *)((long)pvVar1 + 0x88);
    *(undefined8 *)((long)pvVar1 + 0x88) = 0;
    *(uint64_t *)((long)pvVar1 + 0x90) = (uVar3 - lVar2) + *(long *)((long)pvVar1 + 0x90);
    uv_mutex_unlock((uv_mutex_t *)((long)pvVar1 + 0x98));
  }
  return;
}

Assistant:

void uv__metrics_update_idle_time(uv_loop_t* loop) {
  uv__loop_metrics_t* loop_metrics;
  uint64_t entry_time;
  uint64_t exit_time;

  if (!(uv__get_internal_fields(loop)->flags & UV_METRICS_IDLE_TIME))
    return;

  loop_metrics = uv__get_loop_metrics(loop);

  /* The thread running uv__metrics_update_idle_time() is always the same
   * thread that sets provider_entry_time. So it's unnecessary to lock before
   * retrieving this value.
   */
  if (loop_metrics->provider_entry_time == 0)
    return;

  exit_time = uv_hrtime();

  uv_mutex_lock(&loop_metrics->lock);
  entry_time = loop_metrics->provider_entry_time;
  loop_metrics->provider_entry_time = 0;
  loop_metrics->provider_idle_time += exit_time - entry_time;
  uv_mutex_unlock(&loop_metrics->lock);
}